

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O0

void __thiscall dynamicgraph::SignalBase<int>::recompute(SignalBase<int> *this,int *param_1)

{
  ExceptionSignal *this_00;
  undefined8 uVar1;
  allocator<char> local_41;
  string local_40 [36];
  ErrorCodeEnum local_1c;
  int *local_18;
  int *param_1_local;
  SignalBase<int> *this_local;
  
  local_18 = param_1;
  param_1_local = (int *)this;
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_1c = SET_IMPOSSIBLE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Recompute operation not possible with this signal. ",&local_41);
  getName_abi_cxx11_(this);
  uVar1 = std::__cxx11::string::c_str();
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_1c,local_40,"(while trying to recompute %s).",uVar1);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
}

Assistant:

virtual inline void recompute(const Time &) {
    DG_THROW ExceptionSignal(
        ExceptionSignal::SET_IMPOSSIBLE,
        "Recompute operation not possible with this signal. ",
        "(while trying to recompute %s).", this->getName().c_str());
  }